

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNDelegated::gen_code_member
          (CTPNDelegated *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,
          int varargs,CTcNamedArgs *named_args)

{
  short sVar1;
  int iVar2;
  undefined4 in_ECX;
  undefined4 uVar3;
  undefined4 in_register_0000000c;
  long *in_RDX;
  void *__buf;
  void *__buf_00;
  int in_ESI;
  CTcGenTarg *in_RDI;
  int in_R8D;
  int in_R9D;
  vm_prop_id_t prop;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  
  uVar3 = in_ECX;
  iVar2 = CTcCodeStream::is_self_available(G_cs);
  if (iVar2 == 0) {
    CTcTokenizer::log_error(0x2cef);
  }
  iVar2 = CTcGenTarg::is_speculative(G_cg);
  if (iVar2 != 0) {
    err_throw(0);
  }
  (*(code *)**(undefined8 **)in_RDI->max_str_len_)((undefined8 *)in_RDI->max_str_len_,0);
  if (in_R9D != 0) {
    CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
  }
  sVar1 = (**(code **)(*in_RDX + 200))(in_RDX,0,in_ECX);
  if (sVar1 == 0) {
    if (in_R9D != 0) {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    }
    CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    CTcDataStream::write
              (&G_cs->super_CTcDataStream,(int)(char)in_R8D,__buf_00,
               CONCAT44(in_register_0000000c,uVar3));
    CTcGenTarg::note_pop(G_cg,in_R8D + 2);
  }
  else {
    if (in_R9D != 0) {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    }
    CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    CTcDataStream::write
              (&G_cs->super_CTcDataStream,(int)(char)in_R8D,__buf,
               CONCAT44(in_register_0000000c,uVar3));
    CTcDataStream::write_prop_id((CTcDataStream *)in_RDI,in_stack_ffffffffffffffcc);
    CTcGenTarg::note_pop(G_cg,in_R8D + 1);
  }
  CTcGenTarg::post_call_cleanup
            (in_RDI,(CTcNamedArgs *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    CTcGenTarg::note_push((CTcGenTarg *)0x27cd0b);
  }
  return;
}

Assistant:

void CTPNDelegated::gen_code_member(int discard,
                                    CTcPrsNode *prop_expr, int prop_is_expr,
                                    int argc, int varargs,
                                    CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;

    /* 
     *   make sure "self" is available - we obviously can't delegate
     *   anything if we're not in an object's method 
     */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_SELF_NOT_AVAIL);

    /* don't allow 'delegated' in speculative evaluation mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* generate the delegatee expression */
    delegatee_->gen_code(FALSE, FALSE);

    /* if we have an argument counter, put it back on top */
    if (varargs)
        G_cg->write_op(OPC_SWAP);

    /* generate the property value */
    prop = prop_expr->gen_code_propid(FALSE, prop_is_expr);

    /* 
     *   if we got a property ID, generate a simple DELEGATE; otherwise,
     *   generate a PTRDELEGATE 
     */
    if (prop != VM_INVALID_PROP)
    {
        /* add a varargs modifier if needed */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);

        /* we have a constant property ID - generate a regular DELEGATE */
        G_cg->write_op(OPC_DELEGATE);
        G_cs->write((char)argc);
        G_cs->write_prop_id(prop);

        /* this removes arguments and the object value */
        G_cg->note_pop(argc + 1);
    }
    else
    {
        /* 
         *   if we have a varargs list, modify the call instruction that
         *   follows to make it a varargs call 
         */
        if (varargs)
        {
            /* swap the top of the stack to get the arg counter back on top */
            G_cg->write_op(OPC_SWAP);

            /* write the varargs modifier */
            G_cg->write_op(OPC_VARARGC);
        }

        /* a property pointer is on the stack - write a PTRDELEGATE */
        G_cg->write_op(OPC_PTRDELEGATE);
        G_cs->write((int)argc);

        /* this removes arguments, the object, and the property pointer */
        G_cg->note_pop(argc + 2);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if the result is needed, push it */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}